

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

FILE * stb_fopen(char *filename,char *mode)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  undefined8 *v;
  bool bVar4;
  stb__file_data *d;
  int fd;
  int p;
  char temp_full [4108];
  char name_full [4096];
  FILE *f;
  char *mode_local;
  char *filename_local;
  
  if ((*mode == 'w') || (pcVar2 = strchr(mode,0x2b), pcVar2 != (char *)0x0)) {
    temp_full[0x1008] = '\0';
    iVar1 = stb_fullpath(temp_full + 0x1008,0x1000,filename);
    if (iVar1 == 0) {
      filename_local = (char *)0x0;
    }
    else {
      sVar3 = strlen(temp_full + 0x1008);
      d._4_4_ = (int)sVar3;
      do {
        iVar1 = d._4_4_;
        d._4_4_ = iVar1 + -1;
        bVar4 = false;
        if ((((0 < d._4_4_) && (bVar4 = false, temp_full[(long)d._4_4_ + 0x1008] != '/')) &&
            (bVar4 = false, temp_full[(long)d._4_4_ + 0x1008] != '\\')) &&
           (bVar4 = false, temp_full[(long)d._4_4_ + 0x1008] != ':')) {
          bVar4 = temp_full[(long)d._4_4_ + 0x1008] != '~';
        }
      } while (bVar4);
      memcpy(&fd,temp_full + 0x1008,(long)iVar1);
      strcpy((char *)((long)&fd + (long)iVar1),"stmpXXXXXX");
      iVar1 = mkstemp((char *)&fd);
      if (iVar1 == -1) {
        filename_local = (char *)0x0;
      }
      else {
        filename_local = (char *)fdopen(iVar1,mode);
        if ((FILE *)filename_local == (FILE *)0x0) {
          unlink((char *)&fd);
          close(iVar1);
          filename_local = (char *)0x0;
        }
        else if ((FILE *)filename_local == (FILE *)0x0) {
          filename_local = (char *)0x0;
        }
        else {
          v = (undefined8 *)malloc(0x18);
          if (v == (undefined8 *)0x0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                          ,0x1579,"FILE *stb_fopen(char *, char *)");
          }
          if (stb__files == (stb_ptrmap *)0x0) {
            stb__files = stb_ptrmap_create();
          }
          pcVar2 = strdup((char *)&fd);
          *v = pcVar2;
          pcVar2 = strdup(temp_full + 0x1008);
          v[1] = pcVar2;
          *(undefined4 *)(v + 2) = 0;
          stb_ptrmap_add(stb__files,filename_local,v);
        }
      }
    }
  }
  else {
    filename_local = (char *)fopen(filename,mode);
  }
  return (FILE *)filename_local;
}

Assistant:

FILE *  stb_fopen(char *filename, char *mode)
{
   FILE *f;
   char name_full[4096];
   char temp_full[sizeof(name_full) + 12];
   int p;
#ifdef _MSC_VER
   int j;
#endif
   if (mode[0] != 'w' && !strchr(mode, '+'))
      return stb__fopen(filename, mode);

   // save away the full path to the file so if the program
   // changes the cwd everything still works right! unix has
   // better ways to do this, but we have to work in windows
   name_full[0] = '\0'; // stb_fullpath reads name_full[0]
   if (stb_fullpath(name_full, sizeof(name_full), filename)==0)
      return 0;

   // try to generate a temporary file in the same directory
   p = strlen(name_full)-1;
   while (p > 0 && name_full[p] != '/' && name_full[p] != '\\'
                && name_full[p] != ':' && name_full[p] != '~')
      --p;
   ++p;

   memcpy(temp_full, name_full, p);

   #ifdef _MSC_VER
   // try multiple times to make a temp file... just in
   // case some other process makes the name first
   for (j=0; j < 32; ++j) {
      strcpy(temp_full+p, "stmpXXXXXX");
      if (stb_mktemp(temp_full) == NULL)
         return 0;

      f = fopen(temp_full, mode);
      if (f != NULL)
         break;
   }
   #else
   {
      strcpy(temp_full+p, "stmpXXXXXX");
      #ifdef __MINGW32__
         int fd = open(mktemp(temp_full), O_RDWR);
      #else
         int fd = mkstemp(temp_full);
      #endif
      if (fd == -1) return NULL;
      f = fdopen(fd, mode);
      if (f == NULL) {
         unlink(temp_full);
         close(fd);
         return NULL;
      }
   }
   #endif
   if (f != NULL) {
      stb__file_data *d = (stb__file_data *) malloc(sizeof(*d));
      if (!d) { assert(0);  /* NOTREACHED */fclose(f); return NULL; }
      if (stb__files == NULL) stb__files = stb_ptrmap_create();
      d->temp_name = strdup(temp_full);
      d->name      = strdup(name_full);
      d->errors    = 0;
      stb_ptrmap_add(stb__files, f, d);
      return f;
   }

   return NULL;
}